

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

void secp256k1_ecmult_odd_multiples_table
               (int n,secp256k1_ge *pre_a,secp256k1_fe *zr,secp256k1_fe *z,secp256k1_gej *a)

{
  uint64_t *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  ulong uVar61;
  long lVar62;
  ulong uVar63;
  secp256k1_fe *rzr;
  secp256k1_gej d;
  secp256k1_ge d_ge;
  secp256k1_gej local_188;
  secp256k1_gej local_108;
  secp256k1_ge local_88;
  
  if (a->infinity == 0) {
    secp256k1_gej_double(&local_108,a);
  }
  else {
    local_108.infinity = 1;
    local_108.x.n[0] = 0;
    local_108.x.n[1] = 0;
    local_108.x.n[2] = 0;
    local_108.x.n[3] = 0;
    local_108.x.n[4] = 0;
    local_108.y.n[0] = 0;
    local_108.y.n[1] = 0;
    local_108.y.n[2] = 0;
    local_108.y.n[3] = 0;
    local_108.y.n[4] = 0;
    local_108.z.n[0] = 0;
    local_108.z.n[1] = 0;
    local_108.z.n[2] = 0;
    local_108.z.n[3] = 0;
    local_108.z.n[4] = 0;
  }
  local_88.infinity = 0;
  local_88.x.n[0] = local_108.x.n[0];
  local_88.x.n[1] = local_108.x.n[1];
  local_88.x.n[2] = local_108.x.n[2];
  local_88.x.n[3] = local_108.x.n[3];
  local_88.x.n[4] = local_108.x.n[4];
  local_88.y.n[0] = local_108.y.n[0];
  local_88.y.n[1] = local_108.y.n[1];
  local_88.y.n[2] = local_108.y.n[2];
  local_88.y.n[3] = local_108.y.n[3];
  local_88.y.n[4] = local_108.y.n[4];
  secp256k1_ge_set_gej_zinv(pre_a,a,&local_108.z);
  local_188.infinity = pre_a->infinity;
  local_188.x.n[4] = (pre_a->x).n[4];
  local_188.x.n[0] = (pre_a->x).n[0];
  local_188.x.n[1] = (pre_a->x).n[1];
  local_188.x.n[2] = (pre_a->x).n[2];
  local_188.x.n[3] = (pre_a->x).n[3];
  local_188.y.n[0] = (pre_a->y).n[0];
  local_188.y.n[1] = (pre_a->y).n[1];
  local_188.y.n[2] = (pre_a->y).n[2];
  local_188.y.n[3] = (pre_a->y).n[3];
  local_188.y.n[4] = (pre_a->y).n[4];
  local_188.z.n[0] = (a->z).n[0];
  local_188.z.n[1] = (a->z).n[1];
  local_188.z.n[2] = (a->z).n[2];
  local_188.z.n[3] = (a->z).n[3];
  local_188.z.n[4] = (a->z).n[4];
  zr->n[4] = local_108.z.n[4];
  zr->n[2] = local_108.z.n[2];
  zr->n[3] = local_108.z.n[3];
  zr->n[0] = local_108.z.n[0];
  zr->n[1] = local_108.z.n[1];
  if (1 < n) {
    rzr = zr + 1;
    lVar62 = 0x58;
    do {
      secp256k1_gej_add_ge_var(&local_188,&local_188,&local_88,rzr);
      *(undefined4 *)((long)(&pre_a->y + 1) + lVar62) = 0;
      puVar1 = (uint64_t *)((long)(pre_a->x).n + lVar62);
      *puVar1 = local_188.x.n[0];
      puVar1[1] = local_188.x.n[1];
      puVar1 = (uint64_t *)((long)(pre_a->x).n + lVar62 + 0x10);
      *puVar1 = local_188.x.n[2];
      puVar1[1] = local_188.x.n[3];
      *(uint64_t *)((long)(pre_a->x).n + lVar62 + 0x20) = local_188.x.n[4];
      puVar1 = (uint64_t *)((long)(pre_a->y).n + lVar62);
      *puVar1 = local_188.y.n[0];
      puVar1[1] = local_188.y.n[1];
      puVar1 = (uint64_t *)((long)(pre_a->y).n + lVar62 + 0x10);
      *puVar1 = local_188.y.n[2];
      puVar1[1] = local_188.y.n[3];
      *(uint64_t *)((long)(pre_a->y).n + lVar62 + 0x20) = local_188.y.n[4];
      lVar62 = lVar62 + 0x58;
      rzr = rzr + 1;
    } while ((ulong)(uint)n * 0x58 - lVar62 != 0);
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_108.z.n[3];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = local_188.z.n[0];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_108.z.n[2];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = local_188.z.n[1];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_108.z.n[1];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = local_188.z.n[2];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_108.z.n[0];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = local_188.z.n[3];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_108.z.n[4];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = local_188.z.n[4];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = SUB168(auVar6 * auVar37,0);
  auVar2 = auVar3 * auVar34 + auVar2 * auVar33 + auVar4 * auVar35 + auVar5 * auVar36 +
           auVar7 * ZEXT816(0x1000003d10);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_108.z.n[4];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = local_188.z.n[0];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_108.z.n[3];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = local_188.z.n[1];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_108.z.n[2];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = local_188.z.n[2];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_108.z.n[1];
  auVar41._8_8_ = 0;
  auVar41._0_8_ = local_188.z.n[3];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_108.z.n[0];
  auVar42._8_8_ = 0;
  auVar42._0_8_ = local_188.z.n[4];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = SUB168(auVar6 * auVar37,8);
  auVar3 = auVar13 * ZEXT816(0x1000003d10000) +
           auVar12 * auVar42 + auVar11 * auVar41 + auVar10 * auVar40 + auVar9 * auVar39 +
           auVar8 * auVar38 + (auVar2 >> 0x34);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_108.z.n[0];
  auVar43._8_8_ = 0;
  auVar43._0_8_ = local_188.z.n[0];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_108.z.n[4];
  auVar44._8_8_ = 0;
  auVar44._0_8_ = local_188.z.n[1];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_108.z.n[3];
  auVar45._8_8_ = 0;
  auVar45._0_8_ = local_188.z.n[2];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_108.z.n[2];
  auVar46._8_8_ = 0;
  auVar46._0_8_ = local_188.z.n[3];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_108.z.n[1];
  auVar47._8_8_ = 0;
  auVar47._0_8_ = local_188.z.n[4];
  auVar4 = auVar18 * auVar47 + auVar17 * auVar46 + auVar16 * auVar45 + auVar15 * auVar44 +
           (auVar3 >> 0x34);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = (auVar4._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar3._6_2_ & 0xf);
  auVar5 = auVar19 * ZEXT816(0x1000003d1) + auVar14 * auVar43;
  uVar61 = auVar5._0_8_;
  uVar63 = auVar5._8_8_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_108.z.n[1];
  auVar48._8_8_ = 0;
  auVar48._0_8_ = local_188.z.n[0];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_108.z.n[0];
  auVar49._8_8_ = 0;
  auVar49._0_8_ = local_188.z.n[1];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_108.z.n[4];
  auVar50._8_8_ = 0;
  auVar50._0_8_ = local_188.z.n[2];
  auVar58._8_8_ = uVar63 >> 0x34;
  auVar58._0_8_ = uVar63 * 0x1000 | uVar61 >> 0x34;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_108.z.n[3];
  auVar51._8_8_ = 0;
  auVar51._0_8_ = local_188.z.n[3];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_108.z.n[2];
  auVar52._8_8_ = 0;
  auVar52._0_8_ = local_188.z.n[4];
  auVar4 = auVar22 * auVar50 + auVar24 * auVar52 + auVar23 * auVar51 + (auVar4 >> 0x34);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
  auVar58 = auVar25 * ZEXT816(0x1000003d10) + auVar21 * auVar49 + auVar20 * auVar48 + auVar58;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_108.z.n[2];
  auVar53._8_8_ = 0;
  auVar53._0_8_ = local_188.z.n[0];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_108.z.n[1];
  auVar54._8_8_ = 0;
  auVar54._0_8_ = local_188.z.n[1];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = local_108.z.n[0];
  auVar55._8_8_ = 0;
  auVar55._0_8_ = local_188.z.n[2];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_108.z.n[4];
  auVar56._8_8_ = 0;
  auVar56._0_8_ = local_188.z.n[3];
  auVar30._8_8_ = 0;
  auVar30._0_8_ = local_108.z.n[3];
  auVar57._8_8_ = 0;
  auVar57._0_8_ = local_188.z.n[4];
  auVar4 = auVar30 * auVar57 + auVar29 * auVar56 + (auVar4 >> 0x34);
  z->n[0] = uVar61 & 0xfffffffffffff;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = auVar4._0_8_;
  z->n[1] = auVar58._0_8_ & 0xfffffffffffff;
  auVar5 = auVar31 * ZEXT816(0x1000003d10) +
           auVar28 * auVar55 + auVar27 * auVar54 + auVar26 * auVar53 + (auVar58 >> 0x34);
  auVar6 = auVar5 >> 0x34;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = auVar6._0_8_;
  z->n[2] = auVar5._0_8_ & 0xfffffffffffff;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = auVar4._8_8_;
  auVar59._8_8_ = auVar6._8_8_;
  auVar59._0_8_ = auVar2._0_8_ & 0xfffffffffffff;
  auVar60 = auVar32 * ZEXT816(0x1000003d10000) + auVar59 + auVar60;
  uVar61 = auVar60._0_8_;
  z->n[3] = uVar61 & 0xfffffffffffff;
  z->n[4] = (auVar60._8_8_ << 0xc | uVar61 >> 0x34) + (auVar3._0_8_ & 0xffffffffffff);
  return;
}

Assistant:

static void secp256k1_ecmult_odd_multiples_table(int n, secp256k1_ge *pre_a, secp256k1_fe *zr, secp256k1_fe *z, const secp256k1_gej *a) {
    secp256k1_gej d, ai;
    secp256k1_ge d_ge;
    int i;

    VERIFY_CHECK(!a->infinity);

    secp256k1_gej_double_var(&d, a, NULL);

    /*
     * Perform the additions using an isomorphic curve Y^2 = X^3 + 7*C^6 where C := d.z.
     * The isomorphism, phi, maps a secp256k1 point (x, y) to the point (x*C^2, y*C^3) on the other curve.
     * In Jacobian coordinates phi maps (x, y, z) to (x*C^2, y*C^3, z) or, equivalently to (x, y, z/C).
     *
     *     phi(x, y, z) = (x*C^2, y*C^3, z) = (x, y, z/C)
     *   d_ge := phi(d) = (d.x, d.y, 1)
     *     ai := phi(a) = (a.x*C^2, a.y*C^3, a.z)
     *
     * The group addition functions work correctly on these isomorphic curves.
     * In particular phi(d) is easy to represent in affine coordinates under this isomorphism.
     * This lets us use the faster secp256k1_gej_add_ge_var group addition function that we wouldn't be able to use otherwise.
     */
    secp256k1_ge_set_xy(&d_ge, &d.x, &d.y);
    secp256k1_ge_set_gej_zinv(&pre_a[0], a, &d.z);
    secp256k1_gej_set_ge(&ai, &pre_a[0]);
    ai.z = a->z;

    /* pre_a[0] is the point (a.x*C^2, a.y*C^3, a.z*C) which is equivalent to a.
     * Set zr[0] to C, which is the ratio between the omitted z(pre_a[0]) value and a.z.
     */
    zr[0] = d.z;

    for (i = 1; i < n; i++) {
        secp256k1_gej_add_ge_var(&ai, &ai, &d_ge, &zr[i]);
        secp256k1_ge_set_xy(&pre_a[i], &ai.x, &ai.y);
    }

    /* Multiply the last z-coordinate by C to undo the isomorphism.
     * Since the z-coordinates of the pre_a values are implied by the zr array of z-coordinate ratios,
     * undoing the isomorphism here undoes the isomorphism for all pre_a values.
     */
    secp256k1_fe_mul(z, &ai.z, &d.z);
}